

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_writer.cpp
# Opt level: O2

BlockPointer __thiscall duckdb::MetadataWriter::GetBlockPointer(MetadataWriter *this)

{
  idx_t iVar1;
  idx_t in_RCX;
  MetaBlockPointer MVar2;
  BlockPointer BVar3;
  MetaBlockPointer meta_pointer;
  
  MVar2 = GetMetaBlockPointer(this);
  iVar1 = MetadataManager::GetMetadataBlockSize(this->manager);
  meta_pointer.offset = (int)iVar1;
  meta_pointer.unused_padding = (int)(iVar1 >> 0x20);
  meta_pointer.block_pointer = MVar2._8_8_;
  BVar3 = MetadataManager::ToBlockPointer
                    ((MetadataManager *)MVar2.block_pointer,meta_pointer,in_RCX);
  return BVar3;
}

Assistant:

BlockPointer MetadataWriter::GetBlockPointer() {
	return MetadataManager::ToBlockPointer(GetMetaBlockPointer(), GetManager().GetMetadataBlockSize());
}